

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_limit.cpp
# Opt level: O1

uint __thiscall
ON_SubDQuadNeighborhood::SetLimitSubSurfaceExactCVs
          (ON_SubDQuadNeighborhood *this,bool bEnableApproximatePatch,uint quadrant_index)

{
  ON_SubDFace *pOVar1;
  ON_SubDVertex *this_00;
  double (*paadVar2) [5] [3];
  double (*paadVar3) [5] [3];
  bool bVar4;
  bool bVar5;
  char cVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  double *pdVar16;
  ON_SubDQuadNeighborhood *pOVar17;
  double (*padVar18) [3];
  undefined7 in_register_00000031;
  long lVar19;
  int iVar20;
  int iVar21;
  ulong uVar22;
  int iVar23;
  double (*padVar24) [3];
  uint uVar25;
  double Q [3] [3];
  ON_SubDVertex *center_vertices [4];
  ON_2dex srf_cv_dex [8];
  double (*local_168) [5] [3];
  int local_160;
  int local_15c;
  double local_158 [5];
  double local_130;
  double local_128;
  double local_120;
  double local_118;
  uint local_104;
  uint local_100;
  uint local_fc;
  ON_SubDQuadNeighborhood *local_f8;
  ulong local_f0;
  double (*local_e8 [3]) [3];
  ulong local_d0;
  uint local_c4;
  ON_SubDFace *(*local_c0) [3];
  ON_SubDEdge *(*local_b8) [2];
  ulong local_b0;
  double *local_a8;
  ulong local_a0;
  ON_SubDVertex *local_98 [4];
  ON_2dex local_78;
  ON_2dex local_70;
  ON_2dex local_68;
  ON_2dex local_60;
  ON_2dex local_58;
  ON_2dex local_50;
  ON_2dex local_48;
  ON_2dex local_40 [2];
  
  uVar8 = 0;
  if (this->m_initial_subdivision_level < this->m_current_subdivision_level) {
    uVar8 = (uint)this->m_current_subdivision_level;
  }
  local_160 = (int)CONCAT71(in_register_00000031,bEnableApproximatePatch);
  if ((local_160 != 0) && (((byte)uVar8 < 2 || (1 < this->m_extraordinary_corner_vertex_count)))) {
    ON_SubDIncrementErrorCount();
    local_160 = 0;
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd_limit.cpp"
               ,0x543,"","bEnableApproximatePatch should be false at this stage.");
  }
  pOVar1 = this->m_face_grid[1][1];
  if (((pOVar1 == (ON_SubDFace *)0x0) || (4 < quadrant_index)) || (pOVar1->m_edge_count != 4)) {
LAB_006271a3:
    ON_SubDIncrementErrorCount();
    uVar8 = 0;
  }
  else {
    local_c0 = this->m_face_grid;
    local_98[0] = this->m_vertex_grid[1][1];
    local_98[1] = this->m_vertex_grid[2][1];
    local_98[2] = this->m_vertex_grid[2][2];
    local_98[3] = this->m_vertex_grid[1][2];
    lVar9 = 0;
    do {
      if ((local_98[lVar9] == (ON_SubDVertex *)0x0) ||
         (this->m_center_edges[lVar9] == (ON_SubDEdge *)0x0)) goto LAB_006271a3;
      lVar9 = lVar9 + 1;
    } while (lVar9 != 4);
    local_168 = this->m_srf_cv1;
    bVar4 = ON_IsValid(this->m_srf_cv1[2][2][0]);
    local_f8 = this;
    local_c4 = uVar8;
    if (!bVar4) {
      bVar4 = ON_SubDFace::GetSubdivisionPoint(this->m_face_grid[1][1],&local_128);
      if (!bVar4) goto LAB_006271a3;
      ON_2dex::ON_2dex(&local_78,1,1);
      ON_2dex::ON_2dex(&local_70,2,1);
      ON_2dex::ON_2dex(&local_68,3,1);
      ON_2dex::ON_2dex(&local_60,3,2);
      ON_2dex::ON_2dex(&local_58,3,3);
      ON_2dex::ON_2dex(&local_50,2,3);
      ON_2dex::ON_2dex(&local_48,1,3);
      ON_2dex::ON_2dex(local_40,1,2);
      lVar9 = 0;
      padVar18 = local_e8[1];
      padVar24 = local_e8[0];
      do {
        bVar4 = ON_SubDVertex::GetSubdivisionPoint
                          (*(ON_SubDVertex **)((long)local_98 + lVar9),local_158);
        local_e8[0] = padVar24;
        local_e8[1] = padVar18;
        if ((!bVar4) ||
           (bVar4 = ON_SubDEdge::GetSubdivisionPoint
                              (*(ON_SubDEdge **)((long)local_f8->m_center_edges + lVar9),
                               local_158 + 3), !bVar4)) goto LAB_006271a3;
        padVar24 = local_168[*(int *)((long)&local_78.i + lVar9 * 2)] +
                   *(int *)((long)&local_78.j + lVar9 * 2);
        (*padVar24)[0] = local_158[0];
        (*padVar24)[1] = local_158[1];
        (*padVar24)[2] = local_158[2];
        padVar18 = local_168[*(int *)((long)&local_70.i + lVar9 * 2)] +
                   *(int *)((long)&local_70.j + lVar9 * 2);
        (*padVar18)[0] = local_158[3];
        (*padVar18)[1] = local_158[4];
        (*padVar18)[2] = local_130;
        lVar9 = lVar9 + 8;
      } while (lVar9 != 0x20);
      local_f8->m_srf_cv1[2][2][0] = local_128;
      local_f8->m_srf_cv1[2][2][1] = local_120;
      local_f8->m_srf_cv1[2][2][2] = local_118;
      local_e8[0] = padVar24;
      local_e8[1] = padVar18;
      local_e8[2] = this->m_srf_cv1[2] + 2;
    }
    uVar15 = (ulong)(quadrant_index + 1);
    if (quadrant_index == 4) {
      uVar15 = 4;
      quadrant_index = 0;
    }
    bVar4 = quadrant_index < (uint)uVar15;
    if (bVar4) {
      local_b8 = local_f8->m_edge_grid;
      uVar22 = (ulong)quadrant_index;
      local_a8 = local_f8->m_srf_cv1[0][0] + 2;
      local_104 = 0;
      local_100 = 0;
      pOVar17 = local_f8;
      local_fc = (uint)uVar15;
      local_b0 = uVar15;
      do {
        if (pOVar17->m_bExactQuadrantPatch[uVar22] == true) {
          local_100 = local_100 + 1;
LAB_0062657b:
          local_f0 = (ulong)((int)uVar22 - 1U & 3);
          uVar15 = 0;
          iVar23 = 9;
          local_d0 = uVar22;
          do {
            uVar8 = (uint)local_f0;
            if ((int)uVar15 == 0) {
              uVar8 = (uint)uVar22;
            }
            uVar25 = uVar8 - 1;
            lVar9 = 1;
            uVar12 = 0;
            if (uVar25 < 3) {
              lVar9 = *(long *)(&DAT_006e2418 + (ulong)uVar25 * 8);
              uVar12 = *(uint *)(&DAT_006e2310 + (ulong)uVar25 * 4);
              iVar20 = *(int *)(&DAT_006e231c + (ulong)uVar25 * 4);
              iVar21 = 2 - uVar8;
            }
            else {
              iVar21 = 0;
              iVar20 = 1;
            }
            local_e8[0] = local_168[lVar9] + uVar12;
            iVar7 = (int)lVar9 + iVar20;
            paadVar2 = local_168 + iVar7;
            paadVar3 = local_168 + (iVar7 + iVar20);
            local_15c = iVar23;
            local_e8[1] = *paadVar2 + (int)(uVar12 + iVar21);
            local_e8[2] = *paadVar3 + (int)(uVar12 + iVar21 + iVar21);
            local_a0 = uVar15;
            bVar5 = ON_IsValid((*local_e8[0])[0]);
            if (((bVar5) && (bVar5 = ON_IsValid((*paadVar2)[(int)(uVar12 + iVar21)][0]), bVar5)) &&
               (bVar5 = ON_IsValid((*paadVar3)[(int)(uVar12 + iVar21 + iVar21)][0]), bVar5)) {
              iVar20 = 0xd;
              pOVar17 = local_f8;
              uVar22 = local_d0;
              iVar23 = local_15c + 3;
            }
            else {
              pOVar17 = local_f8;
              uVar15 = (ulong)uVar8;
              if ((char)local_160 == '\0') {
                cVar6 = local_f8->m_bBoundaryCrease[uVar15];
              }
              else {
                cVar6 = ON_SubDEdge::IsCrease(local_f8->m_center_edges[uVar15]);
              }
              uVar22 = local_d0;
              iVar23 = local_15c;
              if (cVar6 != '\0') {
                lVar10 = 1;
                lVar9 = 1;
                lVar11 = 1;
                if (uVar25 < 3) {
                  lVar9 = *(long *)(&DAT_006e23b8 + (ulong)uVar25 * 8);
                  lVar11 = *(long *)(&DAT_006e23d0 + (ulong)uVar25 * 8);
                }
                uVar13 = 2;
                if (uVar25 < 3) {
                  lVar10 = *(long *)(&DAT_006e23a0 + (ulong)uVar25 * 8);
                  uVar13 = uVar15;
                }
                lVar19 = 0x10;
                pdVar16 = local_a8;
                do {
                  *(double *)((long)&local_168 + lVar19) =
                       (pdVar16[lVar11 * 3 + lVar9 * 0xf + -2] +
                       pdVar16[lVar11 * 3 + lVar9 * 0xf + -2]) -
                       pdVar16[uVar13 * 3 + lVar10 * 0xf + -2];
                  *(double *)((long)&local_160 + lVar19) =
                       (pdVar16[lVar11 * 3 + lVar9 * 0xf + -1] +
                       pdVar16[lVar11 * 3 + lVar9 * 0xf + -1]) -
                       pdVar16[uVar13 * 3 + lVar10 * 0xf + -1];
                  *(double *)((long)local_158 + lVar19) =
                       (pdVar16[lVar11 * 3 + lVar9 * 0xf] + pdVar16[lVar11 * 3 + lVar9 * 0xf]) -
                       pdVar16[uVar13 * 3 + lVar10 * 0xf];
                  pdVar16 = pdVar16 + (long)iVar21 * 3 + (long)iVar20 * 0xf;
                  lVar19 = lVar19 + 0x18;
                } while (lVar19 != 0x58);
                goto LAB_006267c7;
              }
              iVar20 = 0xd;
              if (((1 < (byte)local_c4) || (pOVar17->m_bExactQuadrantPatch[local_d0] != false)) &&
                 (bVar5 = ON_SubDEdge::IsSmoothNotX(pOVar17->m_center_edges[uVar15]),
                 iVar23 = local_15c, bVar5)) {
                if (local_b8[uVar15][0] == (ON_SubDEdge *)0x0) {
                  if (pOVar17->m_bExactQuadrantPatch[uVar22] != true) {
                    local_158[0] = -1.23432101234321e+308;
                    goto LAB_006268b9;
                  }
                }
                else {
                  bVar5 = ON_SubDEdge::GetSubdivisionPoint(local_b8[uVar15][0],local_158);
                  if (bVar5) {
LAB_006268b9:
                    if (uVar25 < 3) {
                      lVar11 = 2 - (ulong)uVar25;
                      lVar9 = *(long *)(&DAT_006e2328 + (ulong)uVar25 * 8);
                    }
                    else {
                      lVar11 = 1;
                      lVar9 = 0;
                    }
                    if (local_c0[lVar11][lVar9] == (ON_SubDFace *)0x0) {
                      if (pOVar17->m_bExactQuadrantPatch[uVar22] != true) {
                        local_158[3] = -1.23432101234321e+308;
                        goto LAB_0062691e;
                      }
                    }
                    else {
                      bVar5 = ON_SubDFace::GetSubdivisionPoint
                                        (local_c0[lVar11][lVar9],local_158 + 3);
                      if (bVar5) {
LAB_0062691e:
                        if (local_b8[uVar15][1] == (ON_SubDEdge *)0x0) {
                          if (pOVar17->m_bExactQuadrantPatch[uVar22] != true) {
                            local_128 = -1.23432101234321e+308;
                            goto LAB_006267c7;
                          }
                        }
                        else {
                          bVar5 = ON_SubDEdge::GetSubdivisionPoint(local_b8[uVar15][1],&local_128);
                          if (bVar5) {
LAB_006267c7:
                            pdVar16 = local_158;
                            lVar9 = 0;
                            do {
                              padVar24 = local_e8[lVar9];
                              bVar5 = ON_IsValid((*padVar24)[0]);
                              if (bVar5) {
                                iVar23 = iVar23 + 1;
                              }
                              else {
                                bVar5 = ON_IsValid(*pdVar16);
                                if (bVar5) {
                                  iVar23 = iVar23 + 1;
                                  (*padVar24)[0] = *pdVar16;
                                  (*padVar24)[1] = pdVar16[1];
                                  (*padVar24)[2] = pdVar16[2];
                                }
                              }
                              lVar9 = lVar9 + 1;
                              pdVar16 = pdVar16 + 3;
                            } while (lVar9 != 3);
                            iVar20 = 0;
                            goto LAB_00626956;
                          }
                        }
                      }
                    }
                  }
                }
                ON_SubDIncrementErrorCount();
                iVar20 = 1;
              }
            }
LAB_00626956:
            if ((iVar20 != 0xd) && (iVar20 != 0)) goto LAB_00626992;
            uVar15 = (ulong)((int)local_a0 + 1);
          } while ((int)local_a0 == 0);
          iVar20 = 0xb;
LAB_00626992:
          uVar15 = (ulong)local_fc;
          if (iVar20 == 0xb) {
            if ((pOVar17->m_bExactQuadrantPatch[uVar22] != false) ||
               ((char)local_160 == '\x01' && pOVar17->m_bExtraordinaryCornerVertex[uVar22] == false)
               ) {
              iVar20 = (int)uVar22;
              uVar8 = iVar20 - 1;
              if (uVar8 < 3) {
                lVar9 = *(long *)(&DAT_006e2340 + (ulong)uVar8 * 8);
                lVar11 = *(long *)(&DAT_006e2358 + (ulong)uVar8 * 8);
              }
              else {
                lVar9 = 0;
                lVar11 = 0;
              }
              padVar24 = local_168[lVar9] + lVar11;
              local_e8[0] = padVar24;
              bVar5 = ON_IsValid((*padVar24)[0]);
              if (bVar5) {
                iVar23 = iVar23 + 1;
              }
              else {
                this_00 = local_98[uVar22];
                bVar5 = ON_SubDVertex::IsSmooth(this_00);
                if (bVar5) {
                  if ((this_00->m_edge_count == 4) && (this_00->m_face_count == 4)) {
                    uVar8 = iVar20 - 1;
                    if (uVar8 < 3) {
                      lVar9 = *(long *)(&DAT_006e2370 + (ulong)uVar8 * 8);
                      lVar11 = *(long *)(&DAT_006e2388 + (ulong)uVar8 * 8);
                    }
                    else {
                      lVar9 = 0;
                      lVar11 = 0;
                    }
                    if ((local_c0[lVar9][lVar11] == (ON_SubDFace *)0x0) ||
                       (bVar5 = ON_SubDFace::GetSubdivisionPoint(local_c0[lVar9][lVar11],local_158),
                       !bVar5)) {
                      ON_SubDIncrementErrorCount();
                      bVar5 = false;
                    }
                    else {
                      iVar23 = iVar23 + 1;
                      (*padVar24)[0] = local_158[0];
                      (*padVar24)[1] = local_158[1];
                      (*padVar24)[2] = local_158[2];
                      bVar5 = true;
                    }
                    iVar20 = 1;
                    if (!bVar5) goto LAB_00626a13;
                  }
                }
                else {
                  bVar5 = ON_SubDVertex::IsCrease(this_00);
                  if (bVar5) {
                    if (pOVar17->m_bBoundaryCrease[uVar22] == true) {
                      if (pOVar17->m_bBoundaryCrease[local_f0] != true) {
                        if (pOVar17->m_bBoundaryCrease[local_f0] != false) goto LAB_00626d36;
                        uVar8 = iVar20 - 1;
                        if (uVar8 < 3) {
                          lVar9 = *(long *)(&DAT_006e23e8 + (ulong)uVar8 * 8);
                          lVar11 = *(long *)(&DAT_006e2400 + (ulong)uVar8 * 8);
                        }
                        else {
                          lVar11 = 1;
                          lVar9 = 0;
                        }
                        local_158[0] = local_168[lVar9][lVar11][0];
                        local_158[1] = local_168[lVar9][lVar11][1];
                        local_158[2] = local_168[lVar9][lVar11][2];
                        uVar8 = iVar20 - 1;
                        if (uVar8 < 3) {
                          lVar9 = *(long *)(&DAT_006e2448 + (ulong)uVar8 * 8);
                          uVar13 = (ulong)(uVar8 * 2);
                        }
                        else {
                          uVar13 = 2;
                          lVar9 = 0;
                        }
                        local_158[3] = local_168[lVar9][uVar13][0];
                        local_158[4] = local_168[lVar9][uVar13][1];
                        local_130 = local_168[lVar9][uVar13][2];
                        goto LAB_00626ed8;
                      }
                      lVar11 = 1;
                      uVar13 = 2;
                      uVar14 = 2;
                      lVar9 = 1;
                      if (iVar20 - 1U < 3) {
                        uVar14 = (ulong)(4 - iVar20);
                        lVar9 = *(long *)(&DAT_006e23a0 + (ulong)(iVar20 - 1U) * 8);
                      }
                      local_158[0] = local_168[uVar14][lVar9][0];
                      local_158[1] = local_168[uVar14][lVar9][1];
                      local_158[2] = local_168[uVar14][lVar9][2];
                      if (iVar20 - 1U < 3) {
                        lVar11 = *(long *)(&DAT_006e23a0 + (ulong)(iVar20 - 1U) * 8);
                        uVar13 = uVar22 & 0xffffffff;
                      }
                      local_158[3] = local_168[lVar11][uVar13][0];
                      local_158[4] = local_168[lVar11][uVar13][1];
                      local_130 = local_168[lVar11][uVar13][2];
                      local_128 = pOVar17->m_srf_cv1[2][2][0];
                      local_120 = pOVar17->m_srf_cv1[2][2][1];
                      local_118 = pOVar17->m_srf_cv1[2][2][2];
                      bVar5 = ON_IsValid(local_158[0]);
                      if (((bVar5) && (bVar5 = ON_IsValid(local_158[3]), bVar5)) &&
                         (bVar5 = ON_IsValid(local_128), paadVar2 = local_168, bVar5)) {
                        uVar8 = iVar20 - 1;
                        lVar9 = 1;
                        lVar11 = 1;
                        if (uVar8 < 3) {
                          lVar9 = *(long *)(&DAT_006e23b8 + (ulong)uVar8 * 8);
                          lVar11 = *(long *)(&DAT_006e23d0 + (ulong)uVar8 * 8);
                        }
                        bVar5 = ON_IsValid(local_168[lVar9][lVar11][0]);
                        if (bVar5) {
                          padVar18 = paadVar2[lVar9] + lVar11;
                          (*padVar24)[0] =
                               (*padVar18)[0] * -8.0 + (local_158[0] + local_158[3]) * 4.0 +
                               local_128;
                          (*padVar24)[1] =
                               (*padVar18)[1] * -8.0 + (local_158[1] + local_158[4]) * 4.0 +
                               local_120;
                          iVar23 = iVar23 + 1;
                          (*padVar24)[2] =
                               (*padVar18)[2] * -8.0 + (local_158[2] + local_130) * 4.0 + local_118;
                          uVar15 = (ulong)local_fc;
                        }
                        else {
                          uVar15 = (ulong)local_fc;
                        }
                      }
                    }
                    else {
LAB_00626d36:
                      if ((pOVar17->m_bBoundaryCrease[uVar22] == false) &&
                         (pOVar17->m_bBoundaryCrease[local_f0] == true)) {
                        uVar8 = iVar20 - 1;
                        if (uVar8 < 3) {
                          lVar9 = *(long *)(&DAT_006e2418 + (ulong)uVar8 * 8);
                          lVar11 = *(long *)(&DAT_006e2430 + (ulong)uVar8 * 8);
                        }
                        else {
                          lVar9 = 1;
                          lVar11 = 0;
                        }
                        local_158[0] = local_168[lVar9][lVar11][0];
                        local_158[1] = local_168[lVar9][lVar11][1];
                        local_158[2] = local_168[lVar9][lVar11][2];
                        uVar8 = iVar20 - 1;
                        if (uVar8 < 3) {
                          lVar11 = 4 - (ulong)(uVar8 * 2);
                          lVar9 = *(long *)(&DAT_006e2448 + (ulong)uVar8 * 8);
                        }
                        else {
                          lVar11 = 2;
                          lVar9 = 0;
                        }
                        local_158[3] = local_168[lVar11][lVar9][0];
                        local_158[4] = local_168[lVar11][lVar9][1];
                        local_130 = local_168[lVar11][lVar9][2];
LAB_00626ed8:
                        bVar5 = ON_IsValid(local_158[0]);
                        if ((bVar5) && (bVar5 = ON_IsValid(local_158[3]), bVar5)) {
                          iVar23 = iVar23 + 1;
                          (*padVar24)[0] = (local_158[0] + local_158[0]) - local_158[3];
                          (*padVar24)[1] = (local_158[1] + local_158[1]) - local_158[4];
                          (*padVar24)[2] = (local_158[2] + local_158[2]) - local_130;
                        }
                      }
                      else if (pOVar17->m_bExactQuadrantPatch[uVar22] == true) {
                        ON_SubDIncrementErrorCount();
                        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd_limit.cpp"
                                   ,0x661,"","Why is this happening?");
                      }
                    }
                  }
                }
              }
            }
            local_104 = local_104 + (iVar23 == 0x10);
            iVar20 = 0;
          }
LAB_00626a13:
          if (iVar20 != 0) break;
        }
        else if ((char)local_160 != '\0') goto LAB_0062657b;
        uVar22 = uVar22 + 1;
        bVar4 = uVar22 < local_b0;
      } while ((int)uVar15 != (int)uVar22);
    }
    else {
      local_100 = 0;
      local_104 = 0;
    }
    uVar8 = 0;
    if ((!bVar4) && (uVar8 = local_104, local_104 < local_100)) {
      ON_SubDIncrementErrorCount();
    }
  }
  return uVar8;
}

Assistant:

unsigned int ON_SubDQuadNeighborhood::SetLimitSubSurfaceExactCVs(
  bool bEnableApproximatePatch,
  unsigned int quadrant_index
  )
{
  // When subdivision_count >= 2, there should be 3 or 4 or more exact quadrants.
  // When the original SubD face is an n-gon, it is subdivided into quads and m_initial_subdivision_level = 1.
  const unsigned char subdivision_count
    = (m_current_subdivision_level > m_initial_subdivision_level)
    ? m_current_subdivision_level
    : 0;  if (bEnableApproximatePatch && (subdivision_count < 2 || m_extraordinary_corner_vertex_count > 1))
  {
    ON_SUBD_ERROR("bEnableApproximatePatch should be false at this stage.");
    bEnableApproximatePatch = false;
  }

  if (nullptr == m_face_grid[1][1] || 4 != m_face_grid[1][1]->m_edge_count || quadrant_index > 4)
    return ON_SUBD_RETURN_ERROR(0);

  // faces_vertices[] face, in counterclockwise order.  
  // m_center_edges[] are the 4 edges of face in counterclockwise order with 
  // m_center_edges[0] connecting face_vertices[0] and face_vertices[1].
  // However, it may be that face->Vertex(0) != face_vertices[0].
  const ON_SubDVertex* center_vertices[4] = { m_vertex_grid[1][1], m_vertex_grid[2][1], m_vertex_grid[2][2], m_vertex_grid[1][2] };
  for (unsigned int i = 0; i < 4; i++)
  {
    if (nullptr == center_vertices[i])
      return ON_SUBD_RETURN_ERROR(0);
    if (nullptr == m_center_edges[i])
      return ON_SUBD_RETURN_ERROR(0);
  }

  ON_2dex dex;
  ON_2dex deltadex;
  const ON_SubDFace* face;
  unsigned int i;
  double Q[3][3];
  double* P1[3];

  if (!ON_IsValid(m_srf_cv1[2][2][0]))
  {
    // All sub surfaces require inner 3x3 grid of subdivision points
    // In all cases these are the 9 subdivision points of the central quad
    // 9 points
    // = the quad face subdivision point at m_srf_cv1[2][2]
    // + 4 edge subdivision pointsat m_srf_cv1[2][1], m_srf_cv1[3][2], m_srf_cv1[2][3], m_srf_cv1[1][2]
    // + 4 vertex subdivision points at m_srf_cv1[1][1], m_srf_cv1[3][1], m_srf_cv1[3][3], m_srf_cv1[1][3] 
    face = m_face_grid[1][1];

    // The value of m_srf_cv1[2][2][0] is used to determine when the inner 3x3 grid is set, 
    // so its value must be set after the 8 cvs around it are successfully set.
    // The value 
    //   Q[2] = face subd point 
    // is calculated here because if face->GetSubdivisionPoint() fails,
    // nothing below should succeed. The value of Q[2] is assigned to m_srf_cv1[2][2]
    // after the 8 ring points are successfully calculated.
    if (!face->GetSubdivisionPoint(Q[2]))
    {
      return ON_SUBD_RETURN_ERROR(0);
    }


    const ON_2dex srf_cv_dex[8] = { { 1, 1 }, { 2, 1 }, { 3, 1 }, { 3, 2 }, { 3, 3 }, { 2, 3 }, { 1, 3 }, { 1, 2 } };

    for (unsigned int fei = 0; fei < 4; fei++)
    {
      if (!center_vertices[fei]->GetSubdivisionPoint( Q[0]))
        return ON_SUBD_RETURN_ERROR(0);
      if (!m_center_edges[fei]->GetSubdivisionPoint( Q[1]))
        return ON_SUBD_RETURN_ERROR(0);

      dex = srf_cv_dex[2 * fei];
      P1[0] = m_srf_cv1[dex.i][dex.j];
      P1[0][0] = Q[0][0]; P1[0][1] = Q[0][1]; P1[0][2] = Q[0][2];

      dex = srf_cv_dex[2 * fei + 1];
      P1[1] = m_srf_cv1[dex.i][dex.j];
      P1[1][0] = Q[1][0]; P1[1][1] = Q[1][1]; P1[1][2] = Q[1][2];
    }

    // m_srf_cv1[2][2][0] is used to determine when the inner 3x3 grid is set, 
    // so its value must be set after the 8 cvs around it are successfully set.
    P1[2] = m_srf_cv1[2][2];
    P1[2][0] = Q[2][0]; P1[2][1] = Q[2][1]; P1[2][2] = Q[2][2];
  }

  const unsigned int fvi_min = (4 == quadrant_index) ? 0 : quadrant_index;
  const unsigned int fvi_max = (4 == quadrant_index) ? 4 : fvi_min+1;
  unsigned int set_quadrant_count = 0;
  unsigned int exact_quadrant_count = 0;
  for (unsigned int fvi = fvi_min; fvi < fvi_max; fvi++)
  {
    if (m_bExactQuadrantPatch[fvi])
      ++exact_quadrant_count;
    else if (false == bEnableApproximatePatch)
      continue;

    unsigned int set_cv_count = 9; // 3x3 grid is set

    const unsigned int fvi3 = (fvi + 3) % 4;

    for (unsigned int side_pass = 0; side_pass < 2; side_pass++)
    {
      const unsigned int side_fvi = (0 == side_pass) ? fvi : fvi3;

      dex = ON_SubDQuadNeighborhood::GridDex(5, side_fvi, 1, 0);
      deltadex = ON_SubDQuadNeighborhood::DeltaDex(side_fvi, 1, 0);
      P1[0] = &m_srf_cv1[dex.i][dex.j][0];
      dex.i += deltadex.i;
      dex.j += deltadex.j;
      P1[1] = &m_srf_cv1[dex.i][dex.j][0];
      dex.i += deltadex.i;
      dex.j += deltadex.j;
      P1[2] = &m_srf_cv1[dex.i][dex.j][0];
      if (ON_IsValid(P1[0][0]) && ON_IsValid(P1[1][0]) && ON_IsValid(P1[2][0]))
      {
        set_cv_count += 3;
        continue; // Already set
      }

      // m_bBoundaryCrease[] is true if m_center_edges[fvi]->IsCrease() is true AND neither end is a dart vertex.
      // Using bCenterEdgeCrease0 is required to get correct results when bEnableApproximatePatch is true
      const bool bCenterEdgeCrease = bEnableApproximatePatch ? m_center_edges[side_fvi]->IsCrease() : m_bBoundaryCrease[side_fvi];

      if ( bCenterEdgeCrease )
      {
        // When approximation is being applied (m_bExactQuadrantPatch[fvi] is false and bEnableApproximatePatch is true),
        // This technique insures the approximations on either side of the crease 
        // create a continuous edge.
        ON_2dex Adex = ON_SubDQuadNeighborhood::GridDex(5, side_fvi, 1, 1);
        ON_2dex Bdex = ON_SubDQuadNeighborhood::GridDex(5, side_fvi, 1, 2);
        for (i = 0; i < 3; i++)
        {
          const double* A = m_srf_cv1[Adex.i][Adex.j];
          const double* B = m_srf_cv1[Bdex.i][Bdex.j];
          Q[i][0] = 2.0*A[0] - B[0];
          Q[i][1] = 2.0*A[1] - B[1];
          Q[i][2] = 2.0*A[2] - B[2];
          Adex.i += deltadex.i;
          Adex.j += deltadex.j;
          Bdex.i += deltadex.i;
          Bdex.j += deltadex.j;
        }
      }
      else if ( (m_bExactQuadrantPatch[fvi] || subdivision_count >= 2) && m_center_edges[side_fvi]->IsSmoothNotX() )
      {
        const ON_SubDEdge* edge = m_edge_grid[side_fvi][0];
        if (nullptr == edge)
        {
          if (m_bExactQuadrantPatch[fvi])
            return ON_SUBD_RETURN_ERROR(0);
          Q[0][0] = ON_UNSET_VALUE;
        }
        else if (!edge->GetSubdivisionPoint(Q[0]))
          return ON_SUBD_RETURN_ERROR(0);

        const ON_2dex fdex = ON_SubDQuadNeighborhood::GridDex(3, side_fvi, 1, 0);
        face = m_face_grid[fdex.i][fdex.j];
        if (nullptr == face)
        {
          if (m_bExactQuadrantPatch[fvi])
            return ON_SUBD_RETURN_ERROR(0);
          Q[1][0] = ON_UNSET_VALUE;
        }
        else if (!face->GetSubdivisionPoint(Q[1]))
          return ON_SUBD_RETURN_ERROR(0);

        edge = m_edge_grid[side_fvi][1];
        if (nullptr == edge)
        {
          if (m_bExactQuadrantPatch[fvi])
            return ON_SUBD_RETURN_ERROR(0);
          Q[2][0] = ON_UNSET_VALUE;
        }
        else if (!edge->GetSubdivisionPoint(Q[2]))
          return ON_SUBD_RETURN_ERROR(0);
      }
      else
      {
        // Need more subdivisions before these can be set.
        continue;
      }

      for (i = 0; i < 3; i++)
      {
        if (ON_IsValid(P1[i][0]))
        {
          ++set_cv_count;
          continue;
        }
        if (ON_IsValid(Q[i][0]))
        {
          ++set_cv_count;
          P1[i][0] = Q[i][0];
          P1[i][1] = Q[i][1];
          P1[i][2] = Q[i][2];
        }
      }
    }

    if (
      m_bExactQuadrantPatch[fvi] 
      ||
      (false == m_bExtraordinaryCornerVertex[fvi] && bEnableApproximatePatch))
    {
      dex = ON_SubDQuadNeighborhood::GridDex(5, fvi, 0, 0);
      P1[0] = &m_srf_cv1[dex.i][dex.j][0];
      if (ON_IsValid(P1[0][0]))
      {
        ++set_cv_count;
      }
      else
      {
        if ( center_vertices[fvi]->IsSmooth() )
        {
          if (4 == center_vertices[fvi]->m_edge_count && 4 == center_vertices[fvi]->m_face_count)
          {
            dex = ON_SubDQuadNeighborhood::GridDex(3, fvi, 0, 0);
            const ON_SubDFace* face_ij = m_face_grid[dex.i][dex.j];
            if (nullptr == face_ij)
              return ON_SUBD_RETURN_ERROR(0);
            if (!face_ij->GetSubdivisionPoint(Q[0]))
              return ON_SUBD_RETURN_ERROR(0);
            ++set_cv_count;
            P1[0][0] = Q[0][0]; P1[0][1] = Q[0][1]; P1[0][2] = Q[0][2];
          }
        }
        else  if (center_vertices[fvi]->IsCrease())
        {
          if (m_bBoundaryCrease[fvi] && m_bBoundaryCrease[fvi3])
          {
            dex = ON_SubDQuadNeighborhood::GridDex(5, fvi, 2, 1);
            Q[0][0] = m_srf_cv1[dex.i][dex.j][0];
            Q[0][1] = m_srf_cv1[dex.i][dex.j][1];
            Q[0][2] = m_srf_cv1[dex.i][dex.j][2];
            dex = ON_SubDQuadNeighborhood::GridDex(5, fvi, 1, 2);
            Q[1][0] = m_srf_cv1[dex.i][dex.j][0];
            Q[1][1] = m_srf_cv1[dex.i][dex.j][1];
            Q[1][2] = m_srf_cv1[dex.i][dex.j][2];
            dex = ON_SubDQuadNeighborhood::GridDex(5, fvi, 2, 2);
            Q[2][0] = m_srf_cv1[dex.i][dex.j][0];
            Q[2][1] = m_srf_cv1[dex.i][dex.j][1];
            Q[2][2] = m_srf_cv1[dex.i][dex.j][2];

            if (ON_IsValid(Q[0][0]) && ON_IsValid(Q[1][0]) && ON_IsValid(Q[2][0]))
            {
              dex = ON_SubDQuadNeighborhood::GridDex(5, fvi, 1, 1);
              if (ON_IsValid(m_srf_cv1[dex.i][dex.j][0]))
              {
                const double c = -8.0;
                const double b = 4.0;
                ++set_cv_count;
                P1[0][0] = c * m_srf_cv1[dex.i][dex.j][0] + b * (Q[0][0] + Q[1][0]) + Q[2][0];
                P1[0][1] = c * m_srf_cv1[dex.i][dex.j][1] + b * (Q[0][1] + Q[1][1]) + Q[2][1];
                P1[0][2] = c * m_srf_cv1[dex.i][dex.j][2] + b * (Q[0][2] + Q[1][2]) + Q[2][2];
              }
            }
          }
          else if (m_bBoundaryCrease[fvi] && false == m_bBoundaryCrease[fvi3])
          {
            dex = ON_SubDQuadNeighborhood::GridDex(5, fvi, 0, 1);
            Q[0][0] = m_srf_cv1[dex.i][dex.j][0];
            Q[0][1] = m_srf_cv1[dex.i][dex.j][1];
            Q[0][2] = m_srf_cv1[dex.i][dex.j][2];
            dex = ON_SubDQuadNeighborhood::GridDex(5, fvi, 0, 2);
            Q[1][0] = m_srf_cv1[dex.i][dex.j][0];
            Q[1][1] = m_srf_cv1[dex.i][dex.j][1];
            Q[1][2] = m_srf_cv1[dex.i][dex.j][2];

            if (ON_IsValid(Q[0][0]) && ON_IsValid(Q[1][0]))
            {
              ++set_cv_count;
              P1[0][0] = 2.0 * Q[0][0] - Q[1][0];
              P1[0][1] = 2.0 * Q[0][1] - Q[1][1];
              P1[0][2] = 2.0 * Q[0][2] - Q[1][2];
            }
          }
          else if (false == m_bBoundaryCrease[fvi] && m_bBoundaryCrease[fvi3])
          {
            dex = ON_SubDQuadNeighborhood::GridDex(5, fvi, 1, 0);
            Q[0][0] = m_srf_cv1[dex.i][dex.j][0];
            Q[0][1] = m_srf_cv1[dex.i][dex.j][1];
            Q[0][2] = m_srf_cv1[dex.i][dex.j][2];
            dex = ON_SubDQuadNeighborhood::GridDex(5, fvi, 2, 0);
            Q[1][0] = m_srf_cv1[dex.i][dex.j][0];
            Q[1][1] = m_srf_cv1[dex.i][dex.j][1];
            Q[1][2] = m_srf_cv1[dex.i][dex.j][2];

            if (ON_IsValid(Q[0][0]) && ON_IsValid(Q[1][0]))
            {
              ++set_cv_count;
              P1[0][0] = 2.0 * Q[0][0] - Q[1][0];
              P1[0][1] = 2.0 * Q[0][1] - Q[1][1];
              P1[0][2] = 2.0 * Q[0][2] - Q[1][2];
            }
          }
          else if (m_bExactQuadrantPatch[fvi])
          {
            ON_SUBD_ERROR("Why is this happening?");
          }
        }
      }
    }
    if (16 == set_cv_count)
    {
      // quadrant with index fvi is set;
      ++set_quadrant_count;
    }
  }

  if (exact_quadrant_count > set_quadrant_count)
    return ON_SUBD_RETURN_ERROR(set_quadrant_count);

  return set_quadrant_count;
}